

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O1

apx_error_t
apx_socketServerConnection_vtransmit_data_message
          (void *arg,uint32_t write_address,_Bool more_bit,uint8_t *msg_data,int32_t msg_size,
          int32_t *bytes_available)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  apx_error_t aVar5;
  long lVar6;
  uint uVar7;
  uint8_t header [8];
  undefined1 local_50 [8];
  uint8_t *local_48;
  int *local_40;
  ulong local_38;
  
  if (arg == (void *)0x0) {
    aVar5 = 1;
  }
  else {
    iVar2 = rmf_needed_encoding_size(write_address);
    uVar7 = msg_size + iVar2;
    aVar5 = 0x21;
    if (uVar7 <= *(uint *)((long)arg + 0x5c8)) {
      local_48 = msg_data;
      local_40 = bytes_available;
      local_38 = (ulong)(uint)msg_size;
      uVar3 = numheader_encode32(local_50,8,uVar7);
      if (uVar3 == 0) {
        __assert_fail("header1_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server_connection.c"
                      ,0x16b,
                      "apx_error_t connection_transmit_data_message(apx_socketServerConnection_t *, uint32_t, _Bool, const uint8_t *, int32_t, int32_t *)"
                     );
      }
      iVar4 = rmf_address_encode(local_50 + uVar3,8 - uVar3,write_address,more_bit);
      if (iVar4 != iVar2) {
        __assert_fail("header2_size == address_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server_connection.c"
                      ,0x16d,
                      "apx_error_t connection_transmit_data_message(apx_socketServerConnection_t *, uint32_t, _Bool, const uint8_t *, int32_t, int32_t *)"
                     );
      }
      uVar3 = iVar4 + uVar3;
      lVar1 = (long)arg + 0x5b0;
      iVar2 = adt_bytearray_length(lVar1);
      if ((uint)(iVar2 - *(int *)((long)arg + 0x5cc)) < uVar7 + uVar3) {
        connection_send_packet((apx_socketServerConnection_t *)arg);
        if (*(int *)((long)arg + 0x5cc) != 0) {
          __assert_fail("self->pending_bytes == 0u",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server_connection.c"
                        ,0x173,
                        "apx_error_t connection_transmit_data_message(apx_socketServerConnection_t *, uint32_t, _Bool, const uint8_t *, int32_t, int32_t *)"
                       );
        }
      }
      lVar6 = adt_bytearray_data(lVar1);
      memcpy((void *)((ulong)*(uint *)((long)arg + 0x5cc) + lVar6),local_50,(ulong)uVar3);
      *(int *)((long)arg + 0x5cc) = *(int *)((long)arg + 0x5cc) + uVar3;
      lVar6 = adt_bytearray_data(lVar1);
      iVar2 = (int)local_38;
      memcpy((void *)((ulong)*(uint *)((long)arg + 0x5cc) + lVar6),local_48,(long)(int)local_38);
      *(int *)((long)arg + 0x5cc) = *(int *)((long)arg + 0x5cc) + iVar2;
      iVar2 = adt_bytearray_length(lVar1);
      *local_40 = iVar2 - *(int *)((long)arg + 0x5cc);
      aVar5 = 0;
    }
  }
  return aVar5;
}

Assistant:

static apx_error_t connection_transmit_data_message(apx_socketServerConnection_t* self, uint32_t write_address, bool more_bit, uint8_t const* msg_data, int32_t msg_size, int32_t* bytes_available)
{
   if (self != NULL)
   {
      uint8_t header[NUMHEADER32_LONG_SIZE + RMF_HIGH_ADDR_SIZE];
      apx_size_t const address_size = rmf_needed_encoding_size(write_address);
      apx_size_t const payload_size = address_size + msg_size;
      if (payload_size > self->default_buffer_size)
      {
         return APX_MSG_TOO_LARGE_ERROR;
      }
      apx_size_t const header1_size = numheader_encode32(header, sizeof(header), payload_size);
      assert(header1_size > 0);
      apx_size_t const header2_size = rmf_address_encode(header + header1_size, sizeof(header) - header1_size, write_address, more_bit);
      assert(header2_size == address_size);
      apx_size_t const bytes_to_send = header1_size + header2_size + payload_size;
      apx_size_t const buffer_available = ((apx_size_t)adt_bytearray_length(&self->send_buffer)) - self->pending_bytes;
      if (bytes_to_send > buffer_available)
      {
         connection_send_packet(self);
         assert(self->pending_bytes == 0u);
      }
      memcpy(adt_bytearray_data(&self->send_buffer) + self->pending_bytes, header, header1_size + header2_size);
      self->pending_bytes += (header1_size + header2_size);
      memcpy(adt_bytearray_data(&self->send_buffer) + self->pending_bytes, msg_data, msg_size);
      self->pending_bytes += msg_size;
      *bytes_available = (int32_t)(((apx_size_t)adt_bytearray_length(&self->send_buffer)) - self->pending_bytes);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}